

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(defV *data,vector<double,_std::allocator<double>_> *val)

{
  pointer pcVar1;
  pointer pdVar2;
  pointer pdVar3;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__args;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__x;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar8;
  uint *puVar9;
  iterator iVar10;
  complex<double> *cval;
  pointer pcVar11;
  string_view val_00;
  string_view val_01;
  vector<double,_std::allocator<double>_> local_48;
  pointer local_28;
  
  std::vector<double,_std::allocator<double>_>::resize(val,0);
  puVar9 = &switchD_0025d643::switchdataD_00416410;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    __args = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    iVar10._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar10._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)val,iVar10,__args);
      return;
    }
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*__args;
    break;
  case '\x01':
    pvVar7 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(double)*pvVar7;
    iVar10._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar10._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_0025d80f:
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (val,iVar10,(double *)&local_48);
      return;
    }
    break;
  default:
    pvVar6 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    val_01._M_str = (pvVar6->_M_dataplus)._M_p;
    val_01._M_len = pvVar6->_M_string_length;
    helicsGetVector(val_01,val);
    return;
  case '\x03':
    pvVar4 = std::
             get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)pvVar4->_M_value;
    pdVar2 = *(pointer *)(pvVar4->_M_value + 8);
    iVar10._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar10._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      local_28 = pdVar2;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (val,iVar10,(double *)&local_48);
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_28;
    }
    else {
      *iVar10._M_current =
           (double)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar10._M_current + 1;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar2;
    }
    if (((double)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start == 0.0) &&
       (!NAN((double)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start))) {
      return;
    }
    iVar10._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar10._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_0025d80f;
    *iVar10._M_current =
         (double)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    goto LAB_0025d805;
  case '\x04':
    __x = std::
          get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                    (data);
    std::vector<double,_std::allocator<double>_>::operator=(val,__x);
    return;
  case '\x05':
    pvVar8 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::vector<double,_std::allocator<double>_>::reserve
              (val,(long)(pvVar8->
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar8->
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
    pdVar2 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish != pdVar2) {
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar2;
    }
    pcVar1 = (pvVar8->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pcVar11 = (pvVar8->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start; pcVar11 != pcVar1;
        pcVar11 = pcVar11 + 1) {
      if ((*(double *)(pcVar11->_M_value + 8) != 0.0) || (NAN(*(double *)(pcVar11->_M_value + 8))))
      {
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)cabs(*(double *)pcVar11->_M_value);
      }
      else {
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = *(pointer *)pcVar11->_M_value;
      }
      iVar10._M_current =
           (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (val,iVar10,(double *)&local_48);
      }
      else {
        *iVar10._M_current =
             (double)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar10._M_current + 1;
      }
    }
    return;
  case '\x06':
    pvVar5 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    if (!NAN(pvVar5->value)) {
      std::vector<double,_std::allocator<double>_>::resize(val,1);
      *(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start = pvVar5->value;
      return;
    }
    val_00._M_str = (char *)puVar9;
    val_00._M_len = (size_t)(pvVar5->name)._M_dataplus._M_p;
    helicsGetVector(&local_48,(helics *)(pvVar5->name)._M_string_length,val_00);
    pdVar2 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar2 == (pointer)0x0) {
      return;
    }
    operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) {
      return;
    }
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return;
  }
  *iVar10._M_current =
       (double)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_0025d805:
  (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = iVar10._M_current + 1;
  return;
}

Assistant:

void valueExtract(const defV& data, std::vector<double>& val)
{
    val.resize(0);
    switch (data.index()) {
        case double_loc:  // double
            val.push_back(std::get<double>(data));
            break;
        case int_loc:  // int64_t
            val.push_back(static_cast<double>(std::get<int64_t>(data)));
            break;
        case string_loc:  // string
        default:
            helicsGetVector(std::get<std::string>(data), val);
            break;
        case complex_loc:  // complex
        {
            const std::complex<double> cval = std::get<std::complex<double>>(data);
            val.push_back(cval.real());
            if (cval.imag() != 0.0) {
                val.push_back(cval.imag());
            }
        } break;
        case vector_loc:  // vector
            val = std::get<std::vector<double>>(data);
            break;
        case complex_vector_loc:  // complex
        {
            const auto& cvec = std::get<std::vector<std::complex<double>>>(data);
            val.reserve(cvec.size());
            val.clear();
            for (const auto& cval : cvec) {
                if (cval.imag() == 0.0) {
                    val.push_back(cval.real());
                } else {
                    val.push_back(std::abs(cval));
                }
            }
        } break;
        case named_point_loc:  // named point
        {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = helicsGetVector(point.name);
            } else {
                val.resize(1);
                val[0] = point.value;
            }
            break;
        }
    }
}